

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar_p.h
# Opt level: O1

void __thiscall QTabBarPrivate::Tab::startAnimation(Tab *this,QTabBarPrivate *priv,int duration)

{
  long lVar1;
  QWidget *this_00;
  TabBarAnimation *pTVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  QStyle *pQVar6;
  TabBarAnimation *this_01;
  long lVar7;
  long lVar8;
  long in_FS_OFFSET;
  QVariant QStack_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(priv->super_QWidgetPrivate).field_0x8;
  pQVar6 = QWidget::style(this_00);
  lVar7 = 0x71;
  iVar5 = (**(code **)(*(long *)pQVar6 + 0xf0))(pQVar6,0x71,0,this_00,0);
  if (0 < iVar5) {
    if ((this->animation)._M_t.
        super___uniq_ptr_impl<QTabBarPrivate::Tab::TabBarAnimation,_std::default_delete<QTabBarPrivate::Tab::TabBarAnimation>_>
        ._M_t.
        super__Tuple_impl<0UL,_QTabBarPrivate::Tab::TabBarAnimation_*,_std::default_delete<QTabBarPrivate::Tab::TabBarAnimation>_>
        .super__Head_base<0UL,_QTabBarPrivate::Tab::TabBarAnimation_*,_false>._M_head_impl ==
        (TabBarAnimation *)0x0) {
      this_01 = (TabBarAnimation *)operator_new(0x20);
      TabBarAnimation::TabBarAnimation(this_01,this,priv);
      pTVar2 = (this->animation)._M_t.
               super___uniq_ptr_impl<QTabBarPrivate::Tab::TabBarAnimation,_std::default_delete<QTabBarPrivate::Tab::TabBarAnimation>_>
               ._M_t.
               super__Tuple_impl<0UL,_QTabBarPrivate::Tab::TabBarAnimation_*,_std::default_delete<QTabBarPrivate::Tab::TabBarAnimation>_>
               .super__Head_base<0UL,_QTabBarPrivate::Tab::TabBarAnimation_*,_false>._M_head_impl;
      (this->animation)._M_t.
      super___uniq_ptr_impl<QTabBarPrivate::Tab::TabBarAnimation,_std::default_delete<QTabBarPrivate::Tab::TabBarAnimation>_>
      ._M_t.
      super__Tuple_impl<0UL,_QTabBarPrivate::Tab::TabBarAnimation_*,_std::default_delete<QTabBarPrivate::Tab::TabBarAnimation>_>
      .super__Head_base<0UL,_QTabBarPrivate::Tab::TabBarAnimation_*,_false>._M_head_impl = this_01;
      if (pTVar2 != (TabBarAnimation *)0x0) {
        (**(code **)(*(long *)pTVar2 + 0x20))();
      }
    }
    pTVar2 = (this->animation)._M_t.
             super___uniq_ptr_impl<QTabBarPrivate::Tab::TabBarAnimation,_std::default_delete<QTabBarPrivate::Tab::TabBarAnimation>_>
             ._M_t.
             super__Tuple_impl<0UL,_QTabBarPrivate::Tab::TabBarAnimation_*,_std::default_delete<QTabBarPrivate::Tab::TabBarAnimation>_>
             .super__Head_base<0UL,_QTabBarPrivate::Tab::TabBarAnimation_*,_false>._M_head_impl;
    ::QVariant::QVariant(&QStack_48,this->dragOffset);
    QVariantAnimation::setStartValue((QVariant *)pTVar2);
    ::QVariant::~QVariant(&QStack_48);
    pTVar2 = (this->animation)._M_t.
             super___uniq_ptr_impl<QTabBarPrivate::Tab::TabBarAnimation,_std::default_delete<QTabBarPrivate::Tab::TabBarAnimation>_>
             ._M_t.
             super__Tuple_impl<0UL,_QTabBarPrivate::Tab::TabBarAnimation_*,_std::default_delete<QTabBarPrivate::Tab::TabBarAnimation>_>
             .super__Head_base<0UL,_QTabBarPrivate::Tab::TabBarAnimation_*,_false>._M_head_impl;
    ::QVariant::QVariant(&QStack_48,0);
    QVariantAnimation::setEndValue((QVariant *)pTVar2);
    ::QVariant::~QVariant(&QStack_48);
    QVariantAnimation::setDuration
              ((int)(this->animation)._M_t.
                    super___uniq_ptr_impl<QTabBarPrivate::Tab::TabBarAnimation,_std::default_delete<QTabBarPrivate::Tab::TabBarAnimation>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_QTabBarPrivate::Tab::TabBarAnimation_*,_std::default_delete<QTabBarPrivate::Tab::TabBarAnimation>_>
                    .super__Head_base<0UL,_QTabBarPrivate::Tab::TabBarAnimation_*,_false>.
                    _M_head_impl);
    QAbstractAnimation::start
              ((DeletionPolicy)
               (this->animation)._M_t.
               super___uniq_ptr_impl<QTabBarPrivate::Tab::TabBarAnimation,_std::default_delete<QTabBarPrivate::Tab::TabBarAnimation>_>
               ._M_t.
               super__Tuple_impl<0UL,_QTabBarPrivate::Tab::TabBarAnimation_*,_std::default_delete<QTabBarPrivate::Tab::TabBarAnimation>_>
               .super__Head_base<0UL,_QTabBarPrivate::Tab::TabBarAnimation_*,_false>._M_head_impl);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return;
    }
    goto LAB_00499401;
  }
  lVar3 = (priv->tabList).d.size;
  if (lVar3 == 0) {
LAB_004993d8:
    iVar5 = -1;
  }
  else {
    lVar8 = -8;
    do {
      iVar5 = (int)lVar7;
      lVar1 = lVar3 * -8 + lVar8;
      if (lVar1 == -8) goto LAB_004993d2;
      lVar7 = lVar8 + 8;
      lVar4 = lVar8 + 8;
      lVar8 = lVar7;
    } while (*(Tab **)((long)(priv->tabList).d.ptr + lVar4) != this);
    iVar5 = (int)(lVar7 >> 3);
LAB_004993d2:
    if (lVar1 == -8) goto LAB_004993d8;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    moveTabFinished(priv,iVar5);
    return;
  }
LAB_00499401:
  __stack_chk_fail();
}

Assistant:

void startAnimation(QTabBarPrivate *priv, int duration) {
            if (!priv->isAnimated()) {
                priv->moveTabFinished(priv->tabList.indexOf(this));
                return;
            }
            if (!animation)
                animation = std::make_unique<TabBarAnimation>(this, priv);
            animation->setStartValue(dragOffset);
            animation->setEndValue(0);
            animation->setDuration(duration);
            animation->start();
        }